

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall QMimeXMLProvider::addParent(QMimeXMLProvider *this,QString *child,QString *parent)

{
  QList<QString> *this_00;
  
  this_00 = QHash<QString,_QList<QString>_>::operator[](&this->m_parents,child);
  QList<QString>::emplaceBack<QString_const&>(this_00,parent);
  return;
}

Assistant:

void QMimeXMLProvider::addParent(const QString &child, const QString &parent)
{
    m_parents[child].append(parent);
}